

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

float plutovg_canvas_add_text
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                float x,float y)

{
  plutovg_state_t *ppVar1;
  _Bool _Var2;
  plutovg_codepoint_t codepoint;
  float fVar3;
  plutovg_text_iterator_t it;
  float local_3c;
  plutovg_text_iterator_t local_30;
  
  ppVar1 = canvas->state;
  if (ppVar1->font_face == (plutovg_font_face_t *)0x0) {
    local_3c = 0.0;
  }
  else {
    local_3c = 0.0;
    if (0.0 < ppVar1->font_size) {
      plutovg_text_iterator_init(&local_30,text,length,encoding);
      _Var2 = plutovg_text_iterator_has_next(&local_30);
      local_3c = 0.0;
      if (_Var2) {
        local_3c = 0.0;
        do {
          codepoint = plutovg_text_iterator_next(&local_30);
          fVar3 = plutovg_font_face_get_glyph_path
                            (ppVar1->font_face,ppVar1->font_size,local_3c + x,y,codepoint,
                             canvas->path);
          local_3c = local_3c + fVar3;
          _Var2 = plutovg_text_iterator_has_next(&local_30);
        } while (_Var2);
      }
    }
  }
  return local_3c;
}

Assistant:

float plutovg_canvas_add_text(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, float x, float y)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face == NULL || state->font_size <= 0.f)
        return 0.f;
    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text, length, encoding);
    float advance_width = 0.f;
    while(plutovg_text_iterator_has_next(&it)) {
        plutovg_codepoint_t codepoint = plutovg_text_iterator_next(&it);
        advance_width += plutovg_font_face_get_glyph_path(state->font_face, state->font_size, x + advance_width, y, codepoint, canvas->path);
    }

    return advance_width;
}